

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_visit_crossing_edge_pairs.cc
# Opt level: O1

bool s2shapeutil::VisitCrossings
               (S2ShapeIndex *index,CrossingType type,bool need_adjacent,EdgePairVisitor *visitor)

{
  size_type i;
  Edge *p;
  double *pdVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  double *ap;
  S2ShapeIndexCell *cell;
  const_reference pSVar5;
  const_reference pSVar6;
  long lVar7;
  undefined7 in_register_00000011;
  undefined4 uVar8;
  uint64 uVar9;
  int iVar10;
  size_type sVar11;
  Iterator it;
  ShapeEdgeVector shape_edges;
  bool local_475;
  undefined4 local_474;
  _Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false> local_470;
  ulong local_468;
  uint local_45c;
  uint64 local_458;
  S2ShapeIndex *local_450;
  ulong local_448;
  size_type local_440;
  S2LogMessage local_438;
  S2EdgeCrosser local_428;
  InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_> local_3b8;
  
  local_474 = (undefined4)CONCAT71(in_register_00000011,need_adjacent);
  local_3b8.allocator_and_tag_.tag_.size_ = (Tag)0;
  local_450 = index;
  (*index->_vptr_S2ShapeIndex[6])(&local_470,index,0);
  local_45c = (uint)(type == INTERIOR);
  uVar8 = local_474;
  do {
    uVar9 = ((local_470._M_head_impl)->id_).id_;
    if (uVar9 == 0xffffffffffffffff) {
      if (local_470._M_head_impl != (IteratorBase *)0x0) {
        (*(local_470._M_head_impl)->_vptr_IteratorBase[1])();
      }
LAB_0022c8f0:
      absl::InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>::
      clear(&local_3b8);
      return uVar9 == 0xffffffffffffffff;
    }
    local_458 = uVar9;
    cell = S2ShapeIndex::Iterator::cell((Iterator *)&local_470);
    absl::InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>::
    clear(&local_3b8);
    AppendShapeEdges(local_450,cell,&local_3b8);
    local_468 = (ulong)local_3b8.allocator_and_tag_.tag_.size_ >> 1;
    iVar4 = 1;
    if (1 < (int)local_468) {
      iVar4 = (int)local_468;
    }
    local_448 = (ulong)(iVar4 - 1);
    sVar11 = 0;
    do {
      if (sVar11 == local_448) {
        iVar4 = 2;
        break;
      }
      i = sVar11 + 1;
      pSVar5 = absl::
               InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>
               ::operator[](&local_3b8,sVar11);
      if ((char)uVar8 == '\0') {
        pSVar6 = absl::
                 InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>
                 ::operator[](&local_3b8,i);
        dVar2 = (pSVar5->edge_).v1.c_[0];
        if ((dVar2 == (pSVar6->edge_).v0.c_[0]) && (!NAN(dVar2) && !NAN((pSVar6->edge_).v0.c_[0])))
        {
          lVar7 = 0;
          do {
            if (lVar7 == 0x10) {
              iVar10 = (int)sVar11 + 2;
              iVar4 = 2;
              sVar11 = i;
              if ((int)local_468 <= iVar10) goto LAB_0022c8a4;
              goto LAB_0022c735;
            }
            dVar2 = *(double *)((long)(pSVar5->edge_).v1.c_ + lVar7 + 8);
            pdVar1 = (double *)((long)(pSVar6->edge_).v0.c_ + lVar7 + 8);
            lVar7 = lVar7 + 8;
          } while ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1)));
        }
      }
      iVar10 = (int)i;
LAB_0022c735:
      local_440 = i;
      S2EdgeCrosser::S2EdgeCrosser(&local_428,&(pSVar5->edge_).v0,&(pSVar5->edge_).v1);
      iVar4 = 0;
      sVar11 = local_440;
      if (iVar10 < (int)local_468) {
        sVar11 = (size_type)iVar10;
        do {
          pSVar6 = absl::
                   InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>
                   ::operator[](&local_3b8,sVar11);
          if ((Edge *)local_428.c_ != (Edge *)0x0) {
            dVar2 = ((S2Point *)(local_428.c_)->c_)->c_[0];
            if ((dVar2 == (pSVar6->edge_).v0.c_[0]) &&
               (!NAN(dVar2) && !NAN((pSVar6->edge_).v0.c_[0]))) {
              lVar7 = 0;
              do {
                if (lVar7 == 0x10) goto LAB_0022c7e3;
                dVar2 = *(double *)((long)((S2Point *)(local_428.c_)->c_)->c_ + lVar7 + 8);
                pdVar1 = (double *)((long)(pSVar6->edge_).v0.c_ + lVar7 + 8);
                lVar7 = lVar7 + 8;
              } while ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1)));
            }
          }
          p = &pSVar6->edge_;
          bVar3 = S2::IsUnitLength(&p->v0);
          if (!bVar3) {
            S2LogMessage::S2LogMessage
                      (&local_438,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.h"
                       ,0x102,kFatal,(ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_438.stream_,"Check failed: S2::IsUnitLength(*c) ",0x23);
            if (!bVar3) {
              abort();
            }
          }
          local_428.c_ = &p->v0;
          local_428.acb_ =
               s2pred::TriageSign(local_428.a_,local_428.b_,&p->v0,&local_428.a_cross_b_);
          local_428.acb_ = -local_428.acb_;
LAB_0022c7e3:
          iVar4 = S2EdgeCrosser::CrossingSign(&local_428,&(pSVar6->edge_).v1);
          if ((int)local_45c <= iVar4) {
            local_475 = iVar4 == 1;
            if ((visitor->super__Function_base)._M_manager == (_Manager_type)0x0) {
              std::__throw_bad_function_call();
            }
            bVar3 = (*visitor->_M_invoker)((_Any_data *)visitor,pSVar5,pSVar6,&local_475);
            if (!bVar3) {
              iVar4 = 1;
              sVar11 = local_440;
              uVar8 = local_474;
              goto LAB_0022c8a4;
            }
          }
          sVar11 = sVar11 + 1;
        } while ((int)sVar11 != (int)local_468);
        iVar4 = 0;
        sVar11 = local_440;
        uVar8 = local_474;
      }
LAB_0022c8a4:
    } while (iVar4 == 0);
    if (iVar4 != 2) {
      uVar9 = local_458;
      if (local_470._M_head_impl != (IteratorBase *)0x0) {
        (*(local_470._M_head_impl)->_vptr_IteratorBase[1])();
        uVar9 = local_458;
      }
      goto LAB_0022c8f0;
    }
    (*(local_470._M_head_impl)->_vptr_IteratorBase[4])();
  } while( true );
}

Assistant:

static bool VisitCrossings(
    const S2ShapeIndex& index, CrossingType type, bool need_adjacent,
    const EdgePairVisitor& visitor) {
  // TODO(ericv): Use brute force if the total number of edges is small enough
  // (using a larger threshold if the S2ShapeIndex is not constructed yet).
  ShapeEdgeVector shape_edges;
  for (S2ShapeIndex::Iterator it(&index, S2ShapeIndex::BEGIN);
       !it.done(); it.Next()) {
    GetShapeEdges(index, it.cell(), &shape_edges);
    if (!VisitCrossings(shape_edges, type, need_adjacent, visitor)) {
      return false;
    }
  }
  return true;
}